

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::InitGoogleTestImpl<wchar_t>(int *argc,wchar_t **argv)

{
  bool bVar1;
  UnitTestImpl *this;
  wchar_t **extraout_RDX;
  wchar_t **streamable;
  wchar_t **extraout_RDX_00;
  ulong uVar2;
  internal *this_00;
  string local_50;
  
  bVar1 = GTestIsInitialized();
  if ((!bVar1) && (0 < *argc)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)g_argvs_abi_cxx11_);
    streamable = extraout_RDX;
    this_00 = (internal *)argv;
    for (uVar2 = 0; uVar2 != (uint)*argc; uVar2 = uVar2 + 1) {
      StreamableToString<wchar_t*>(&local_50,this_00,streamable);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 g_argvs_abi_cxx11_,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      this_00 = this_00 + 8;
      streamable = extraout_RDX_00;
    }
    ParseGoogleTestFlagsOnlyImpl<wchar_t>(argc,argv);
    this = GetUnitTestImpl();
    UnitTestImpl::PostFlagParsingInit(this);
  }
  return;
}

Assistant:

void InitGoogleTestImpl(int* argc, CharType** argv) {
  // We don't want to run the initialization code twice.
  if (GTestIsInitialized()) return;

  if (*argc <= 0) return;

  g_argvs.clear();
  for (int i = 0; i != *argc; i++) {
    g_argvs.push_back(StreamableToString(argv[i]));
  }

#ifdef GTEST_HAS_ABSL
  absl::InitializeSymbolizer(g_argvs[0].c_str());

#ifdef GTEST_HAS_ABSL_FLAGS
  // When using the Abseil Flags library, set the program usage message to the
  // help message, but remove the color-encoding from the message first.
  absl::SetProgramUsageMessage(absl::StrReplaceAll(
      kColorEncodedHelpMessage,
      {{"@D", ""}, {"@R", ""}, {"@G", ""}, {"@Y", ""}, {"@@", "@"}}));
#endif  // GTEST_HAS_ABSL_FLAGS
#endif  // GTEST_HAS_ABSL

  ParseGoogleTestFlagsOnly(argc, argv);
  GetUnitTestImpl()->PostFlagParsingInit();
}